

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngset.c
# Opt level: O3

void png_set_cHRM_XYZ_fixed
               (png_const_structrp png_ptr,png_inforp info_ptr,png_fixed_point int_red_X,
               png_fixed_point int_red_Y,png_fixed_point int_red_Z,png_fixed_point int_green_X,
               png_fixed_point int_green_Y,png_fixed_point int_green_Z,png_fixed_point int_blue_X,
               png_fixed_point int_blue_Y,png_fixed_point int_blue_Z)

{
  png_uint_16 *ppVar1;
  int iVar2;
  png_XYZ local_3c;
  
  if (info_ptr != (png_inforp)0x0 && png_ptr != (png_const_structrp)0x0) {
    local_3c.green_Y = int_green_Y;
    local_3c.green_Z = int_green_Z;
    local_3c.blue_X = int_blue_X;
    local_3c.blue_Y = int_blue_Y;
    local_3c.blue_Z = int_blue_Z;
    local_3c.red_X = int_red_X;
    local_3c.red_Y = int_red_Y;
    local_3c.red_Z = int_red_Z;
    local_3c.green_X = int_green_X;
    iVar2 = png_colorspace_set_endpoints(png_ptr,&info_ptr->colorspace,&local_3c,2);
    if (iVar2 != 0) {
      ppVar1 = &(info_ptr->colorspace).flags;
      *(byte *)ppVar1 = (byte)*ppVar1 | 0x10;
    }
    png_colorspace_sync_info(png_ptr,info_ptr);
  }
  return;
}

Assistant:

void PNGFAPI
png_set_cHRM_XYZ_fixed(png_const_structrp png_ptr, png_inforp info_ptr,
    png_fixed_point int_red_X, png_fixed_point int_red_Y,
    png_fixed_point int_red_Z, png_fixed_point int_green_X,
    png_fixed_point int_green_Y, png_fixed_point int_green_Z,
    png_fixed_point int_blue_X, png_fixed_point int_blue_Y,
    png_fixed_point int_blue_Z)
{
   png_XYZ XYZ;

   png_debug1(1, "in %s storage function", "cHRM XYZ fixed");

   if (png_ptr == NULL || info_ptr == NULL)
      return;

   XYZ.red_X = int_red_X;
   XYZ.red_Y = int_red_Y;
   XYZ.red_Z = int_red_Z;
   XYZ.green_X = int_green_X;
   XYZ.green_Y = int_green_Y;
   XYZ.green_Z = int_green_Z;
   XYZ.blue_X = int_blue_X;
   XYZ.blue_Y = int_blue_Y;
   XYZ.blue_Z = int_blue_Z;

   if (png_colorspace_set_endpoints(png_ptr, &info_ptr->colorspace,
       &XYZ, 2) != 0)
      info_ptr->colorspace.flags |= PNG_COLORSPACE_FROM_cHRM;

   png_colorspace_sync_info(png_ptr, info_ptr);
}